

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

HtaFile * __thiscall hta::storage::file::Metric::file_hta(Metric *this,Duration interval)

{
  _Rb_tree_header *p_Var1;
  map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>_>
  *this_00;
  Mode MVar2;
  undefined1 auVar3 [12];
  key_type kVar4;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>
  _Var5;
  _Base_ptr p_Var6;
  uint uVar7;
  path *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_bool>
  pVar8;
  Write local_b1;
  key_type local_b0;
  path local_a8;
  int64_t local_80 [3];
  int64_t local_68 [3];
  undefined1 local_50 [56];
  
  p_Var6 = (_Base_ptr)(this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->files_hta_)._M_t._M_impl.super__Rb_tree_header;
  _Var5._M_node = (_Base_ptr)p_Var1;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      if (interval.__r <= *(long *)(p_Var6 + 1)) {
        _Var5._M_node = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < interval.__r];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var5._M_node != p_Var1) &&
       (*(long *)(_Var5._M_node + 1) <= interval.__r)) goto LAB_0016d484;
  }
  this_00 = &this->files_hta_;
  MVar2 = this->open_mode_;
  local_b0.__r = interval.__r;
  if (MVar2 == read_write) {
    path_hta_abi_cxx11_(&local_a8,this,interval);
    kVar4.__r = local_b0.__r;
    (**(this->super_Metric)._vptr_Metric)(local_80,this);
    local_50._0_8_ = (pointer)0x2;
    local_50._8_8_ = kVar4.__r;
    local_50._16_8_ = 1;
    local_50._24_8_ = 1000000000;
    local_50._32_8_ = local_80[0];
    local_50._40_8_ = local_80[2];
    local_50._48_4_ = (int)local_80[1];
    local_50._52_4_ = local_80[1]._4_4_;
    pVar8 = std::
            map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
            ::
            try_emplace<hta::storage::file::FileOpenTag::ReadWrite,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                      ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                        *)this_00,&local_b0,(ReadWrite *)&local_b1,&local_a8,(Header *)local_50);
    auVar3 = pVar8._0_12_;
LAB_0016d470:
    _Var5._M_node = auVar3._0_8_;
    uVar7 = auVar3._8_4_;
    this_01 = (path *)&local_a8;
  }
  else {
    if (MVar2 == write) {
      path_hta_abi_cxx11_(&local_a8,this,interval);
      kVar4.__r = local_b0.__r;
      (**(this->super_Metric)._vptr_Metric)(local_68,this);
      local_50._0_8_ = (pointer)0x2;
      local_50._8_8_ = kVar4.__r;
      local_50._16_8_ = 1;
      local_50._24_8_ = 1000000000;
      local_50._32_8_ = local_68[0];
      local_50._40_8_ = local_68[2];
      local_50._48_4_ = (int)local_68[1];
      local_50._52_4_ = local_68[1]._4_4_;
      pVar8 = std::
              map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
              ::
              try_emplace<hta::storage::file::FileOpenTag::Write,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                        ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                          *)this_00,&local_b0,&local_b1,&local_a8,(Header *)local_50);
      auVar3 = pVar8._0_12_;
      goto LAB_0016d470;
    }
    _Var5._M_node = (_Base_ptr)p_Var1;
    if (MVar2 != read) goto LAB_0016d484;
    path_hta_abi_cxx11_((path *)local_50,this,interval);
    pVar8 = std::
            map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
            ::try_emplace<hta::storage::file::FileOpenTag::Read,std::filesystem::__cxx11::path>
                      ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                        *)this_00,&local_b0,(Read *)&local_a8,(path *)local_50);
    _Var5 = pVar8.first._M_node;
    uVar7 = pVar8._8_4_;
    this_01 = (path *)local_50;
  }
  Catch::clara::std::filesystem::__cxx11::path::~path(this_01);
  if ((uVar7 & 1) == 0) {
    __assert_fail("added",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                  ,0x226,"Metric::HtaFile &hta::storage::file::Metric::file_hta(Duration)");
  }
LAB_0016d484:
  return (HtaFile *)&_Var5._M_node[1]._M_parent;
}

Assistant:

Metric::HtaFile& Metric::file_hta(Duration interval)
{
    auto it = files_hta_.find(interval);
    if (it == files_hta_.end())
    {
        bool added;
        switch (open_mode_)
        {
        case Mode::read:
            std::tie(it, added) =
                files_hta_.try_emplace(interval, FileOpenTag::Read(), path_hta(interval));
            break;
        case Mode::write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::Write(), path_hta(interval), Header(interval, meta()));
            break;
        case Mode::read_write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::ReadWrite(), path_hta(interval), Header(interval, meta()));
            break;
        }
        assert(added);
    }
    return it->second;
}